

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O3

shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
Storage::Tape::ZX8081::Parser::get_next_file_data
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  byte bVar1;
  int iVar2;
  SymbolType SVar3;
  undefined8 in_RAX;
  undefined8 *puVar4;
  shared_ptr<Storage::Tape::Tape> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> sVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar2 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->_vptr_Tape)();
  if (((char)iVar2 == '\0') ||
     (_Var5._M_pi = extraout_RDX,
     ((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1)
     != 0)) {
    SVar3 = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,in_RDX);
    _Var5._M_pi = extraout_RDX_00;
    if (SVar3 == FileGap) {
      iVar2 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->_vptr_Tape)();
      if ((char)iVar2 == '\0') goto LAB_0045162a;
      SVar3 = FileGap;
      while (((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr & 1) != 0) {
LAB_0045162a:
        do {
          SVar3 = Parser<Storage::Tape::ZX8081::SymbolType>::get_next_symbol
                            ((Parser<Storage::Tape::ZX8081::SymbolType> *)tape,in_RDX);
          if ((SVar3 & ~Zero) != FileGap) goto LAB_00451652;
          iVar2 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_vptr_Tape)();
        } while ((char)iVar2 == '\0');
      }
LAB_00451652:
      iVar2 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->_vptr_Tape)();
      bVar1 = *(byte *)&tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
      _Var5._M_pi = extraout_RDX_01;
      if (((~(byte)iVar2 | bVar1) & 1) != 0) {
        if ((bVar1 & 1) != 0) {
          __assert_fail("!has_next_symbol_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Tape/Parsers/TapeParser.hpp"
                        ,0x2d,
                        "void Storage::Tape::Parser<Storage::Tape::ZX8081::SymbolType>::return_symbol(SymbolType) [SymbolType = Storage::Tape::ZX8081::SymbolType]"
                       );
        }
        *(undefined1 *)
         &tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
        *(SymbolType *)
         ((long)&(tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi + 4) = SVar3;
        puVar4 = (undefined8 *)operator_new(0x28);
        puVar4[1] = 0x100000001;
        *puVar4 = &PTR___Sp_counted_ptr_inplace_005a39a0;
        puVar4[2] = 0;
        puVar4[3] = 0;
        puVar4[4] = 0;
        *(undefined8 **)
         &(this->
          super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
          ).super_Parser<Storage::Tape::ZX8081::SymbolType>.error_flag_ = puVar4;
        (this->
        super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
        ).super_Parser<Storage::Tape::ZX8081::SymbolType>._vptr_Parser = (_func_int **)(puVar4 + 2);
        while( true ) {
          iVar2 = (**((in_RDX->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_vptr_Tape)();
          if (((char)iVar2 != '\0') &&
             (_Var5._M_pi = extraout_RDX_02,
             ((ulong)tape[1].super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr & 1) == 0)) break;
          iVar2 = get_next_byte((Parser *)tape,in_RDX);
          _Var5._M_pi = extraout_RDX_03;
          if (iVar2 == -1) break;
          uStack_38 = CONCAT17((char)iVar2,(undefined7)uStack_38);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar4 + 2),
                     (uchar *)((long)&uStack_38 + 7));
        }
        goto LAB_00451700;
      }
    }
  }
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>._vptr_Parser = (_func_int **)0x0;
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>.error_flag_ = false;
  *(undefined3 *)
   &(this->
    super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
    ).super_Parser<Storage::Tape::ZX8081::SymbolType>.field_0x9 = 0;
  (this->
  super_PulseClassificationParser<Storage::Tape::ZX8081::WaveType,_Storage::Tape::ZX8081::SymbolType>
  ).super_Parser<Storage::Tape::ZX8081::SymbolType>.next_symbol_ = One;
LAB_00451700:
  sVar6.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var5._M_pi;
  sVar6.
  super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         sVar6.
         super___shared_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::vector<uint8_t>> Parser::get_next_file_data(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	if(is_at_end(tape)) return nullptr;
	SymbolType symbol = get_next_symbol(tape);
	if(symbol != SymbolType::FileGap) {
		return nullptr;
	}
	while((symbol == SymbolType::FileGap || symbol == SymbolType::Unrecognised) && !is_at_end(tape)) {
		symbol = get_next_symbol(tape);
	}
	if(is_at_end(tape)) return nullptr;
	return_symbol(symbol);

	auto result = std::make_shared<std::vector<uint8_t>>();
	int byte;
	while(!is_at_end(tape)) {
		byte = get_next_byte(tape);
		if(byte == -1) return result;
		result->push_back(uint8_t(byte));
	}
	return result;
}